

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FieldDescriptor * __thiscall
google::protobuf::DescriptorPool::FindExtensionByName(DescriptorPool *this,string *name)

{
  Tables *this_00;
  anon_union_8_8_13f84498_for_Symbol_2 aVar1;
  Symbol SVar2;
  
  this_00 = (this->tables_).ptr_;
  if (this_00 != (Tables *)0x0) {
    SVar2 = Tables::FindByNameHelper(this_00,this,name);
    aVar1 = SVar2.field_1;
    if ((SVar2.type != FIELD) ||
       (*(FieldDescriptor *)(aVar1.descriptor + 0x50) == (FieldDescriptor)0x0)) {
      aVar1.descriptor = (Descriptor *)0x0;
    }
    return (FieldDescriptor *)aVar1.descriptor;
  }
  __assert_fail("ptr_ != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                ,0x5f,
                "C *google::protobuf::internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->() const [C = google::protobuf::DescriptorPool::Tables]"
               );
}

Assistant:

const FieldDescriptor* DescriptorPool::FindExtensionByName(
    const string& name) const {
  Symbol result = tables_->FindByNameHelper(this, name);
  if (result.type == Symbol::FIELD &&
      result.field_descriptor->is_extension()) {
    return result.field_descriptor;
  } else {
    return NULL;
  }
}